

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckCloseWithDoublesSucceeds::RunImpl
          (TestCheckCloseWithDoublesSucceeds *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_58;
  double local_38;
  double local_30;
  double local_28 [3];
  TestCheckCloseWithDoublesSucceeds *local_10;
  TestCheckCloseWithDoublesSucceeds *this_local;
  
  local_10 = this;
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_28[0] = 0.5;
  local_30 = 0.5;
  local_38 = 0.0001;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar2,0x10e);
  UnitTest::CheckClose<double,double,double>(results,local_28,&local_30,&local_38,&local_58);
  return;
}

Assistant:

TEST(CheckCloseWithDoublesSucceeds)
{
    CHECK_CLOSE(0.5, 0.5, 0.0001);
}